

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int thread_num;
  int block_size;
  int session_count;
  int timeout;
  CppNet *this;
  string ip;
  Client client;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  string local_110;
  Client local_f0;
  
  if (argc < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "please input [ip] [port] [thread count] [block size] [session count] [time out]",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::string((string *)&local_110,argv[1],(allocator *)&local_f0);
    iVar1 = atoi(argv[2]);
    thread_num = atoi(argv[3]);
    block_size = atoi(argv[4]);
    session_count = atoi(argv[5]);
    timeout = atoi(argv[6]);
    this = (CppNet *)operator_new(0x10);
    (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cppnet::CppNet::Init(this,thread_num);
    Client::Client(&local_f0,block_size,session_count,timeout,&local_110,iVar1,this);
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = operator_new(0x18);
    *(code **)local_130._M_unused._0_8_ = Client::OnConnect;
    *(undefined8 *)((long)local_130._M_unused._0_8_ + 8) = 0;
    *(Client **)((long)local_130._M_unused._0_8_ + 0x10) = &local_f0;
    local_118 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>_>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>_>
                ::_M_manager;
    cppnet::CppNet::SetConnectionCallback(this,(connect_call_back *)&local_130);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = operator_new(0x18);
    *(code **)local_130._M_unused._0_8_ = Client::OnMessage;
    *(undefined8 *)((long)local_130._M_unused._0_8_ + 8) = 0;
    *(Client **)((long)local_130._M_unused._0_8_ + 0x10) = &local_f0;
    local_118 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>_>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>_>
                ::_M_manager;
    cppnet::CppNet::SetReadCallback(this,(read_call_back *)&local_130);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = operator_new(0x18);
    *(code **)local_130._M_unused._0_8_ = Client::OnDisconnect;
    *(undefined8 *)((long)local_130._M_unused._0_8_ + 8) = 0;
    *(Client **)((long)local_130._M_unused._0_8_ + 0x10) = &local_f0;
    local_118 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>_>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_std::_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>_>
                ::_M_manager;
    cppnet::CppNet::SetDisconnectionCallback(this,(connect_call_back *)&local_130);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    Client::Start(&local_f0);
    cppnet::CppNet::Join(this);
    cppnet::CppNet::~CppNet(this);
    operator_delete(this);
    std::
    _Hashtable<std::shared_ptr<cppnet::CNSocket>,_std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_f0._sessions._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._message._M_dataplus._M_p != &local_f0._message.field_2) {
      operator_delete(local_f0._message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._ip._M_dataplus._M_p != &local_f0._ip.field_2) {
      operator_delete(local_f0._ip._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {

    if (argc < 7) {
       std::cout << "please input [ip] [port] [thread count] [block size] [session count] [time out]" << std::endl;
       return -1;
    }
    
    std::string ip    = std::string(argv[1]);
    int port          = atoi(argv[2]);
    int threadCount   = atoi(argv[3]);
    int block_size    = atoi(argv[4]);
    int session_count = atoi(argv[5]);
    int timeout       = atoi(argv[6]);

    cppnet::CppNet* net = new cppnet::CppNet;
    net->Init(threadCount);

    Client client(block_size, session_count, timeout, ip, port, net);

    net->SetConnectionCallback(std::bind(&Client::OnConnect, &client, std::placeholders::_1, std::placeholders::_2));
    net->SetReadCallback(std::bind(&Client::OnMessage, &client, std::placeholders::_1, std::placeholders::_2,
                                   std::placeholders::_3));
    net->SetDisconnectionCallback(std::bind(&Client::OnDisconnect, &client, std::placeholders::_1, std::placeholders::_2));

    client.Start();

    net->Join();

    delete net;

    return 0;
}